

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereRightJoinLoop(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int p2;
  Parse *pParse;
  SrcList *pSVar5;
  Vdbe *v;
  WhereRightJoin *pWVar6;
  WhereLoop *pWVar7;
  Subquery *pSVar8;
  WhereTerm *pWVar9;
  Table *pTab;
  int iVar10;
  Expr *pEVar11;
  WhereInfo *pWInfo_00;
  Index *pIVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  Expr *local_b8;
  ulong local_98;
  SrcList local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pParse = pWInfo->pParse;
  pSVar5 = pWInfo->pTabList;
  v = pParse->pVdbe;
  pWVar6 = pLevel->pRJ;
  pWVar7 = pLevel->pWLoop;
  bVar1 = pLevel->iFrom;
  uVar14 = 0;
  local_98 = 1;
  sqlite3VdbeExplain(pParse,'\x01',"RIGHT-JOIN %s");
  uVar17 = (ulong)(uint)iLevel;
  if (iLevel < 1) {
    uVar17 = uVar14;
  }
  uVar13 = 0;
  for (; uVar17 * 0x70 - uVar14 != 0; uVar14 = uVar14 + 0x70) {
    bVar2 = (&pWInfo->a[0].iFrom)[uVar14];
    uVar13 = uVar13 | *(ulong *)(*(long *)((long)&pWInfo->a[0].pWLoop + uVar14) + 8);
    if ((pWInfo->pTabList->a[bVar2].fg.field_0x1 & 0x40) != 0) {
      pSVar8 = pWInfo->pTabList->a[bVar2].u4.pSubq;
      iVar3 = pSVar8->regResult;
      sqlite3VdbeAddOp3(v,0x4b,0,iVar3,iVar3 + pSVar8->pSelect->pEList->nExpr + -1);
    }
    sqlite3VdbeAddOp1(v,0x88,*(int *)((long)&pWInfo->a[0].iTabCur + uVar14));
    iVar3 = *(int *)((long)&pWInfo->a[0].iIdxCur + uVar14);
    if (iVar3 != 0) {
      sqlite3VdbeAddOp1(v,0x88,iVar3);
    }
  }
  if ((pSVar5->a[bVar1].fg.jointype & 0x40) == 0) {
    uVar17 = pWVar7->maskSelf;
    lVar15 = 0;
    local_b8 = (Expr *)0x0;
    for (lVar16 = 0;
        (lVar15 < (pWInfo->sWC).nTerm &&
        ((pWVar9 = (pWInfo->sWC).a, (*(ushort *)((long)&pWVar9->wtFlags + lVar16) & 0x8002) == 0 ||
         (*(short *)((long)&pWVar9->eOperator + lVar16) == 0x2000)))); lVar16 = lVar16 + 0x38) {
      if (((*(ulong *)((long)&pWVar9->prereqAll + lVar16) & ~(uVar13 | uVar17)) == 0) &&
         (pEVar11 = *(Expr **)((long)&pWVar9->pExpr + lVar16), (pEVar11->flags & 3) == 0)) {
        pEVar11 = sqlite3ExprDup(pParse->db,pEVar11,0);
        local_b8 = sqlite3ExprAnd(pParse,local_b8,pEVar11);
      }
      lVar15 = lVar15 + 1;
    }
  }
  else {
    local_b8 = (Expr *)0x0;
  }
  local_88.nSrc = 1;
  local_88.nAlloc = 1;
  memcpy(local_88.a,pSVar5->a + bVar1,0x48);
  local_88.a[0].fg.jointype = '\0';
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + '\x01';
  pWInfo_00 = sqlite3WhereBegin(pParse,&local_88,local_b8,(ExprList *)0x0,(ExprList *)0x0,
                                (Select *)0x0,0x1000,0);
  if (pWInfo_00 != (WhereInfo *)0x0) {
    iVar10 = pLevel->iTabCur;
    iVar4 = pParse->nMem;
    iVar3 = iVar4 + 1;
    pParse->nMem = iVar3;
    p2 = pWInfo_00->iContinue;
    pTab = pSVar5->a[bVar1].pSTab;
    if ((pTab->tabFlags & 0x80) == 0) {
      sqlite3VdbeAddOp2(v,0x87,iVar10,iVar3);
    }
    else {
      pIVar12 = sqlite3PrimaryKeyIndex(pTab);
      local_98 = (ulong)pIVar12->nKeyCol;
      pParse->nMem = iVar4 + (uint)pIVar12->nKeyCol;
      for (uVar17 = 0; local_98 != uVar17; uVar17 = uVar17 + 1) {
        sqlite3ExprCodeGetColumnOfTable
                  (v,pTab,iVar10,(int)pIVar12->aiColumn[uVar17],(int)uVar17 + iVar3);
      }
    }
    iVar10 = sqlite3VdbeAddOp4Int(v,0x40,pWVar6->regBloom,0,iVar3,(int)local_98);
    sqlite3VdbeAddOp4Int(v,0x1d,pWVar6->iMatch,p2,iVar3,(int)local_98);
    sqlite3VdbeJumpHere(v,iVar10);
    sqlite3VdbeAddOp2(v,10,pWVar6->regReturn,pWVar6->addrSubrtn);
    sqlite3WhereEnd(pWInfo_00);
  }
  sqlite3ExprDelete(pParse->db,local_b8);
  sqlite3VdbeExplainPop(pParse);
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + 0xff;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void sqlite3WhereRightJoinLoop(
  WhereInfo *pWInfo,
  int iLevel,
  WhereLevel *pLevel
){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  WhereRightJoin *pRJ = pLevel->pRJ;
  Expr *pSubWhere = 0;
  WhereClause *pWC = &pWInfo->sWC;
  WhereInfo *pSubWInfo;
  WhereLoop *pLoop = pLevel->pWLoop;
  SrcItem *pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
  SrcList sFrom;
  Bitmask mAll = 0;
  int k;

  ExplainQueryPlan((pParse, 1, "RIGHT-JOIN %s", pTabItem->pSTab->zName));
  sqlite3VdbeNoJumpsOutsideSubrtn(v, pRJ->addrSubrtn, pRJ->endSubrtn,
                                  pRJ->regReturn);
  for(k=0; k<iLevel; k++){
    int iIdxCur;
    SrcItem *pRight;
    assert( pWInfo->a[k].pWLoop->iTab == pWInfo->a[k].iFrom );
    pRight = &pWInfo->pTabList->a[pWInfo->a[k].iFrom];
    mAll |= pWInfo->a[k].pWLoop->maskSelf;
    if( pRight->fg.viaCoroutine ){
      Subquery *pSubq;
      assert( pRight->fg.isSubquery && pRight->u4.pSubq!=0 );
      pSubq = pRight->u4.pSubq;
      assert( pSubq->pSelect!=0 && pSubq->pSelect->pEList!=0 );
      sqlite3VdbeAddOp3(
          v, OP_Null, 0, pSubq->regResult,
          pSubq->regResult + pSubq->pSelect->pEList->nExpr-1
      );
    }
    sqlite3VdbeAddOp1(v, OP_NullRow, pWInfo->a[k].iTabCur);
    iIdxCur = pWInfo->a[k].iIdxCur;
    if( iIdxCur ){
      sqlite3VdbeAddOp1(v, OP_NullRow, iIdxCur);
    }
  }
  if( (pTabItem->fg.jointype & JT_LTORJ)==0 ){
    mAll |= pLoop->maskSelf;
    for(k=0; k<pWC->nTerm; k++){
      WhereTerm *pTerm = &pWC->a[k];
      if( (pTerm->wtFlags & (TERM_VIRTUAL|TERM_SLICE))!=0
       && pTerm->eOperator!=WO_ROWVAL
      ){
        break;
      }
      if( pTerm->prereqAll & ~mAll ) continue;
      if( ExprHasProperty(pTerm->pExpr, EP_OuterON|EP_InnerON) ) continue;
      pSubWhere = sqlite3ExprAnd(pParse, pSubWhere,
                                 sqlite3ExprDup(pParse->db, pTerm->pExpr, 0));
    }
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  memcpy(&sFrom.a[0], pTabItem, sizeof(SrcItem));
  sFrom.a[0].fg.jointype = 0;
  assert( pParse->withinRJSubrtn < 100 );
  pParse->withinRJSubrtn++;
  pSubWInfo = sqlite3WhereBegin(pParse, &sFrom, pSubWhere, 0, 0, 0,
                                WHERE_RIGHT_JOIN, 0);
  if( pSubWInfo ){
    int iCur = pLevel->iTabCur;
    int r = ++pParse->nMem;
    int nPk;
    int jmp;
    int addrCont = sqlite3WhereContinueLabel(pSubWInfo);
    Table *pTab = pTabItem->pSTab;
    if( HasRowid(pTab) ){
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, -1, r);
      nPk = 1;
    }else{
      int iPk;
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      nPk = pPk->nKeyCol;
      pParse->nMem += nPk - 1;
      for(iPk=0; iPk<nPk; iPk++){
        int iCol = pPk->aiColumn[iPk];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, iCol,r+iPk);
      }
    }
    jmp = sqlite3VdbeAddOp4Int(v, OP_Filter, pRJ->regBloom, 0, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeAddOp4Int(v, OP_Found, pRJ->iMatch, addrCont, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, jmp);
    sqlite3VdbeAddOp2(v, OP_Gosub, pRJ->regReturn, pRJ->addrSubrtn);
    sqlite3WhereEnd(pSubWInfo);
  }
  sqlite3ExprDelete(pParse->db, pSubWhere);
  ExplainQueryPlanPop(pParse);
  assert( pParse->withinRJSubrtn>0 );
  pParse->withinRJSubrtn--;
}